

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int *piVar3;
  Allocator *pAVar4;
  Layer *pLVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 extraout_var;
  _func_int **pp_Var11;
  int iVar12;
  size_t totalsize;
  _func_int *p_Var13;
  ulong uVar14;
  iterator __position;
  Option *opt_00;
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  vector<float,_std::allocator<float>_> dequantize_scales;
  void *ptr;
  Option opt_g;
  float scale_out;
  Mat local_1e8;
  undefined1 local_1a8 [16];
  float *local_198;
  int local_190;
  Allocator *local_188;
  int local_180;
  int iStack_17c;
  int iStack_178;
  int iStack_174;
  ulong local_170;
  undefined1 local_168 [32];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  long local_118;
  uint local_10c;
  undefined1 local_108 [40];
  undefined4 local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  ulong local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  Allocator *pAStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  vector<float,_std::allocator<float>_> local_90;
  vector<float,_std::allocator<float>_> local_78;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  uVar1._0_4_ = bottom_blob->h;
  uVar1._4_4_ = bottom_blob->c;
  local_198 = (float *)bottom_blob->elemsize;
  p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
  local_10c = (*(int *)(&this->field_0xbc + (long)p_Var13) + -1) *
              *(int *)(&this->field_0xc4 + (long)p_Var13);
  local_118 = CONCAT44(local_118._4_4_,
                       (*(int *)(&this->field_0xc0 + (long)p_Var13) + -1) *
                       *(int *)(&this->field_0xc8 + (long)p_Var13));
  piVar3 = bottom_blob->refcount;
  local_1a8._0_8_ = bottom_blob->data;
  local_1a8._8_8_ = bottom_blob->refcount;
  local_190 = bottom_blob->elempack;
  local_188 = bottom_blob->allocator;
  uVar2._0_4_ = bottom_blob->dims;
  uVar2._4_4_ = bottom_blob->w;
  uVar8 = bottom_blob->dims;
  uVar9 = bottom_blob->w;
  uVar10 = bottom_blob->h;
  local_170 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  uStack_120 = 0;
  local_180 = (undefined4)uVar2;
  iStack_17c = uVar2._4_4_;
  iStack_178 = (int)uVar1;
  iStack_174 = uVar1._4_4_;
  local_128 = uVar1;
  if (local_198 != (float *)0x1) {
    pAVar4 = opt->workspace_allocator;
    auVar6._4_4_ = -(uint)(uVar2._4_4_ == uVar9);
    auVar6._0_4_ = -(uint)(uVar8 == 3);
    auVar6._8_4_ = -(uint)((int)uVar1 == uVar10);
    auVar6._12_4_ = 0xffffffff;
    iVar12 = movmskps((int)piVar3,auVar6);
    if ((((iVar12 == 0xf) && (local_190 == 1)) && (local_188 == pAVar4)) &&
       (local_198 == (float *)0x1)) {
      uVar1._0_4_ = uVar1._4_4_;
      if ((void *)local_1a8._0_8_ != (void *)0x0) {
LAB_00159b55:
        if ((long)iStack_174 * local_170 != 0) {
          pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
          uVar1._0_4_ = (int)uVar1 / *(int *)(&this->field_0xf0 + (long)pp_Var11[-3]);
          if (0 < *(int *)(&this->field_0xf0 + (long)pp_Var11[-3])) {
            lVar15 = 0;
            lVar16 = 0;
            do {
              uVar7._0_1_ = opt->lightmode;
              uVar7._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar7._4_4_ = opt->num_threads;
              local_108._16_8_ = opt->workspace_allocator;
              local_108[0x18] = opt->use_winograd_convolution;
              local_108[0x19] = opt->use_sgemm_convolution;
              local_108[0x1a] = opt->use_int8_inference;
              local_108[0x1b] = opt->use_vulkan_compute;
              local_108[0x1c] = opt->use_fp16_packed;
              local_108[0x1d] = opt->use_fp16_storage;
              local_108[0x1e] = opt->use_fp16_arithmetic;
              local_108[0x1f] = opt->use_int8_storage;
              local_108._32_8_ = *(undefined8 *)&opt->use_int8_arithmetic;
              local_108._0_4_ = (undefined4)uVar7;
              local_108._4_4_ = 1;
              local_108._8_8_ = local_188;
              local_168._16_8_ = bottom_blob->elemsize;
              local_168._0_8_ =
                   bottom_blob->cstep * lVar15 * local_168._16_8_ + (long)bottom_blob->data;
              local_168._24_4_ = bottom_blob->elempack;
              local_168._8_4_ = 0;
              local_168._12_4_ = 0;
              local_148._8_4_ = 3;
              local_148._0_8_ = bottom_blob->allocator;
              local_148._12_4_ = bottom_blob->w;
              local_138._4_4_ = (int)uVar1;
              local_138._0_4_ = bottom_blob->h;
              local_138._8_8_ =
                   ((long)(bottom_blob->h * bottom_blob->w) * local_168._16_8_ + 0xfU &
                   0xfffffffffffffff0) / (ulong)local_168._16_8_;
              local_1e8.refcount = (int *)0x0;
              local_1e8.data = (void *)(local_170 * lVar15 * (long)local_198 + local_1a8._0_8_);
              local_1e8.elemsize = (size_t)local_198;
              local_1e8.elempack = local_190;
              local_1e8.allocator = local_188;
              local_1e8.dims = 3;
              local_1e8.w = iStack_17c;
              local_1e8.h = iStack_178;
              local_1e8.cstep =
                   ((long)(iStack_178 * iStack_17c) * (long)local_198 + 0xfU & 0xfffffffffffffff0) /
                   (ulong)local_198;
              local_1e8.c = (int)uVar1;
              quantize_float32_to_int8
                        ((Mat *)local_168,&local_1e8,
                         *(float *)(*(long *)(&this->field_0x200 + (long)pp_Var11[-3]) + lVar16 * 4)
                         ,(Option *)local_108);
              if ((pointer)local_1e8.refcount != (pointer)0x0) {
                LOCK();
                *local_1e8.refcount = *local_1e8.refcount + -1;
                UNLOCK();
                if ((float)*local_1e8.refcount == 0.0) {
                  if (local_1e8.allocator == (Allocator *)0x0) {
                    if ((pointer)local_1e8.data != (pointer)0x0) {
                      free(local_1e8.data);
                    }
                  }
                  else {
                    (*(local_1e8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar3 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if ((Allocator *)local_148._0_8_ == (Allocator *)0x0) {
                    if ((void *)local_168._0_8_ != (void *)0x0) {
                      free((void *)local_168._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_148._0_8_)[3])();
                  }
                }
              }
              lVar16 = lVar16 + 1;
              pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
              lVar15 = lVar15 + (int)uVar1;
            } while (lVar16 < *(int *)(&this->field_0xf0 + (long)pp_Var11[-3]));
          }
          goto LAB_001596c4;
        }
      }
    }
    else {
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_188 == (Allocator *)0x0) {
            if ((void *)local_1a8._0_8_ != (void *)0x0) {
              uStack_c0 = 0;
              local_c8 = uVar2;
              free((void *)local_1a8._0_8_);
              uVar1._0_4_ = (int)local_128;
              uVar1._4_4_ = local_128._4_4_;
              uVar2._4_4_ = local_c8._4_4_;
            }
          }
          else {
            uStack_c0 = 0;
            local_c8 = uVar2;
            (*local_188->_vptr_Allocator[3])();
            uVar1._0_4_ = (int)local_128;
            uVar1._4_4_ = local_128._4_4_;
            uVar2._4_4_ = local_c8._4_4_;
          }
        }
      }
      local_1a8 = (undefined1  [16])0x0;
      local_198 = (float *)0x1;
      local_190 = 1;
      local_180 = 3;
      local_170 = (long)((int)uVar1 * uVar2._4_4_) + 0xfU & 0xfffffffffffffff0;
      uVar14 = (long)uVar1._4_4_ * local_170;
      local_188 = pAVar4;
      iStack_17c = uVar2._4_4_;
      iStack_178 = (int)uVar1;
      iStack_174 = uVar1._4_4_;
      if (uVar14 != 0) {
        if (pAVar4 == (Allocator *)0x0) {
          local_168._0_8_ = (void *)0x0;
          uVar1._0_4_ = posix_memalign((void **)local_168,0x10,uVar14 | 4);
          local_1a8._0_8_ = (void *)0x0;
          if ((int)uVar1 == 0) {
            local_1a8._0_8_ = local_168._0_8_;
          }
        }
        else {
          uVar1._0_4_ = (*pAVar4->_vptr_Allocator[2])(pAVar4,uVar14 | 4);
          local_1a8._0_8_ = CONCAT44(extraout_var,(int)uVar1);
        }
        local_1a8._8_8_ = (void *)(uVar14 + local_1a8._0_8_);
        *(undefined4 *)(local_1a8._0_8_ + uVar14) = 1;
        uVar1._0_4_ = local_128._4_4_;
        goto LAB_00159b55;
      }
    }
    uVar1._0_4_ = -100;
    goto LAB_0015a2f8;
  }
  pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
LAB_001596c4:
  local_168._16_8_ = (float *)0x0;
  local_168._24_4_ = 0;
  local_168._0_8_ = (void *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_148 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var11[-3]),(Mat *)local_1a8,
             (Mat *)local_168,opt);
  uVar1._0_4_ = -100;
  if ((void *)local_168._0_8_ != (void *)0x0) {
    if ((long)(int)local_138._4_4_ * local_138._8_8_ != 0) {
      p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
      opt_00 = (Option *)opt->blob_allocator;
      Mat::create(top_blob,(int)(~local_10c + local_148._12_4_) /
                           *(int *)(&this->field_0xcc + (long)p_Var13) + 1,
                  (int)(~(uint)local_118 + local_138._0_4_) /
                  *(int *)(&this->field_0xd0 + (long)p_Var13) + 1,
                  *(int *)(&this->field_0xb8 + (long)p_Var13),
                  ((ulong)(byte)(&this->field_0x244)[(long)p_Var13] ^ 1) * 3 + 1,(Allocator *)opt_00
                 );
      uVar1._4_4_ = local_128._4_4_;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
        p_Var13 = pp_Var11[-3];
        if ((local_128._4_4_ == *(int *)(&this->field_0xf0 + (long)p_Var13)) &&
           (local_128._4_4_ == *(int *)(&this->field_0xb8 + (long)p_Var13))) {
          if ((&this->field_0x244)[(long)p_Var13] == '\x01') {
            local_1e8.data = (void *)0x0;
            local_1e8.refcount = (int *)0x0;
            local_1e8.elemsize = 0;
            p_Var13 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var11[-3]);
            if (0 < *(int *)(&this->field_0xf0 + (long)pp_Var11[-3])) {
              lVar16 = 0;
              do {
                fVar19 = *(float *)(*(long *)(p_Var13 + 0x1c0) + lVar16 * 4);
                fVar18 = 0.0;
                if (fVar19 != 0.0) {
                  fVar18 = 1.0 / (fVar19 * *(float *)(*(long *)(p_Var13 + 0x200) + lVar16 * 4));
                }
                local_108._0_4_ = fVar18;
                local_b8 = CONCAT44(local_b8._4_4_,*(undefined4 *)(p_Var13 + 0x240));
                if (local_1e8.refcount == (int *)local_1e8.elemsize) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&local_1e8,
                             (iterator)local_1e8.refcount,(float *)local_108);
                  __position._M_current = (float *)local_1e8.refcount;
                }
                else {
                  *local_1e8.refcount = (int)fVar18;
                  __position._M_current = (float *)(local_1e8.refcount + 1);
                  local_1e8.refcount = (int *)__position._M_current;
                }
                if (__position._M_current == (float *)local_1e8.elemsize) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&local_1e8,__position,
                             (float *)&local_b8);
                }
                else {
                  *__position._M_current = (float)local_b8;
                  local_1e8.refcount = (int *)(__position._M_current + 1);
                }
                lVar16 = lVar16 + 1;
                p_Var13 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                          (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
              } while (lVar16 < *(int *)(&this->field_0xf0 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            if ((*(int *)(p_Var13 + 0xbc) != 3) || (*(int *)(p_Var13 + 0xc0) != 3)) {
LAB_0015a04e:
              if ((pointer)local_1e8.data != (pointer)0x0) {
                operator_delete(local_1e8.data,local_1e8.elemsize - (long)local_1e8.data);
              }
              goto LAB_0015a065;
            }
            if ((*(int *)(p_Var13 + 0xc4) == 1) &&
               (((*(int *)(p_Var13 + 200) == 1 && (*(int *)(p_Var13 + 0xcc) == 1)) &&
                (*(int *)(p_Var13 + 0xd0) == 1)))) {
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_48,(vector<float,_std::allocator<float>_> *)&local_1e8);
              convdw3x3s1_int8_requant_sse
                        ((Mat *)local_168,top_blob,*(Mat **)(p_Var13 + 0x140),
                         *(Mat **)(p_Var13 + 0x180),&local_48,opt_00);
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
            else {
              if (((*(int *)(p_Var13 + 0xc4) != 1) || (*(int *)(p_Var13 + 200) != 1)) ||
                 ((*(int *)(p_Var13 + 0xcc) != 2 || (*(int *)(p_Var13 + 0xd0) != 2))))
              goto LAB_0015a04e;
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_60,(vector<float,_std::allocator<float>_> *)&local_1e8);
              convdw3x3s2_int8_requant_sse
                        ((Mat *)local_168,top_blob,*(Mat **)(p_Var13 + 0x140),
                         *(Mat **)(p_Var13 + 0x180),&local_60,opt_00);
            }
            if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_60.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_60.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            pLVar5 = this->activation;
            if (pLVar5 != (Layer *)0x0) {
              (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
            }
          }
          else {
            local_1e8.data = (void *)0x0;
            local_1e8.refcount = (int *)0x0;
            local_1e8.elemsize = 0;
            p_Var13 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var11[-3]);
            if (0 < *(int *)(&this->field_0xf0 + (long)pp_Var11[-3])) {
              lVar16 = 0;
              do {
                fVar19 = 1.0 / (*(float *)(*(long *)(p_Var13 + 0x1c0) + lVar16 * 4) *
                               *(float *)(*(long *)(p_Var13 + 0x200) + lVar16 * 4));
                local_108._0_4_ = fVar19;
                if (local_1e8.refcount == (int *)local_1e8.elemsize) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&local_1e8,
                             (iterator)local_1e8.refcount,(float *)local_108);
                  pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
                }
                else {
                  *local_1e8.refcount = (int)fVar19;
                  local_1e8.refcount = local_1e8.refcount + 1;
                }
                lVar16 = lVar16 + 1;
                p_Var13 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var11[-3]);
              } while (lVar16 < *(int *)(&this->field_0xf0 + (long)pp_Var11[-3]));
            }
            if ((*(int *)(p_Var13 + 0xbc) != 3) || (*(int *)(p_Var13 + 0xc0) != 3))
            goto LAB_0015a04e;
            if ((*(int *)(p_Var13 + 0xcc) == 1) &&
               (((*(int *)(p_Var13 + 0xd0) == 1 && (*(int *)(p_Var13 + 0xc4) == 1)) &&
                (*(int *)(p_Var13 + 200) == 1)))) {
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_78,(vector<float,_std::allocator<float>_> *)&local_1e8);
              convdw3x3s1_int8_dequant_sse
                        ((Mat *)local_168,top_blob,*(Mat **)(p_Var13 + 0x140),
                         *(Mat **)(p_Var13 + 0x180),&local_78,opt_00);
              local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
            else {
              if ((((*(int *)(p_Var13 + 0xcc) != 2) || (*(int *)(p_Var13 + 0xd0) != 2)) ||
                  (*(int *)(p_Var13 + 0xc4) != 1)) || (*(int *)(p_Var13 + 200) != 1))
              goto LAB_0015a04e;
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_90,(vector<float,_std::allocator<float>_> *)&local_1e8);
              convdw3x3s2_int8_dequant_sse
                        ((Mat *)local_168,top_blob,*(Mat **)(p_Var13 + 0x140),
                         *(Mat **)(p_Var13 + 0x180),&local_90,opt_00);
            }
            if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_90.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_90.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            pLVar5 = this->activation;
            if (pLVar5 != (Layer *)0x0) {
              (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
            }
          }
          if ((pointer)local_1e8.data != (pointer)0x0) {
            operator_delete(local_1e8.data,local_1e8.elemsize - (long)local_1e8.data);
          }
        }
        else {
LAB_0015a065:
          uVar1._0_4_ = *(int *)(&this->field_0xf0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
          ;
          uVar2._4_4_ = *(int *)(&this->field_0xb8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                        / (int)uVar1;
          if (0 < (int)uVar1) {
            local_128 = CONCAT44(local_128._4_4_,uVar1._4_4_ / (int)uVar1);
            local_118 = (long)(uVar1._4_4_ / (int)uVar1);
            lVar17 = 0;
            lVar15 = 0;
            lVar16 = 0;
            do {
              local_1e8.refcount = (int *)0x0;
              local_1e8.data =
                   (void *)(local_138._8_8_ * lVar17 * local_168._16_8_ + local_168._0_8_);
              local_1e8.elemsize = local_168._16_8_;
              local_1e8.elempack = local_168._24_4_;
              local_1e8.allocator = (Allocator *)local_148._0_8_;
              local_1e8.dims = 3;
              local_1e8.w = local_148._12_4_;
              local_1e8.h = local_138._0_4_;
              local_1e8.c = (int)local_128;
              local_1e8.cstep =
                   ((long)(int)(local_138._0_4_ * local_148._12_4_) * local_168._16_8_ + 0xfU &
                   0xfffffffffffffff0) / (ulong)local_168._16_8_;
              local_dc = top_blob->w;
              local_108._16_8_ = top_blob->elemsize;
              local_108._0_8_ = top_blob->cstep * lVar15 * local_108._16_8_ + (long)top_blob->data;
              local_d8 = top_blob->h;
              local_108._32_8_ = top_blob->allocator;
              local_108._8_8_ = (Allocator *)0x0;
              local_108._24_4_ = top_blob->elempack;
              local_e0 = 3;
              local_d0 = ((long)(local_d8 * local_dc) * local_108._16_8_ + 0xfU & 0xfffffffffffffff0
                         ) / (ulong)local_108._16_8_;
              pLVar5 = (this->group_ops).
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar16];
              local_b8._0_1_ = opt->lightmode;
              local_b8._1_3_ = *(undefined3 *)&opt->field_0x1;
              local_b8._4_4_ = opt->num_threads;
              local_a8 = *(undefined4 *)&opt->workspace_allocator;
              uStack_a4 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
              uStack_a0._0_1_ = opt->use_winograd_convolution;
              uStack_a0._1_1_ = opt->use_sgemm_convolution;
              uStack_a0._2_1_ = opt->use_int8_inference;
              uStack_a0._3_1_ = opt->use_vulkan_compute;
              uStack_9c._0_1_ = opt->use_fp16_packed;
              uStack_9c._1_1_ = opt->use_fp16_storage;
              uStack_9c._2_1_ = opt->use_fp16_arithmetic;
              uStack_9c._3_1_ = opt->use_int8_storage;
              local_98._0_1_ = opt->use_int8_arithmetic;
              local_98._1_1_ = opt->use_packing_layout;
              local_98._2_1_ = opt->use_shader_pack8;
              local_98._3_1_ = opt->use_bf16_storage;
              local_98._4_4_ = *(undefined4 *)&opt->field_0x24;
              local_d4 = uVar2._4_4_;
              pAStack_b0 = (Allocator *)local_108._32_8_;
              (*pLVar5->_vptr_Layer[7])(pLVar5,&local_1e8,local_108,&local_b8);
              if ((Allocator *)local_108._8_8_ != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_108._8_8_ = *(int *)(_func_int ***)local_108._8_8_ + -1
                ;
                UNLOCK();
                if (*(int *)(_func_int ***)local_108._8_8_ == 0) {
                  if ((Allocator *)local_108._32_8_ == (Allocator *)0x0) {
                    if ((void *)local_108._0_8_ != (void *)0x0) {
                      free((void *)local_108._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_108._32_8_)[3])();
                  }
                }
              }
              if ((pointer)local_1e8.refcount != (pointer)0x0) {
                LOCK();
                *local_1e8.refcount = *local_1e8.refcount + -1;
                UNLOCK();
                if ((float)*local_1e8.refcount == 0.0) {
                  if (local_1e8.allocator == (Allocator *)0x0) {
                    if ((pointer)local_1e8.data != (pointer)0x0) {
                      free(local_1e8.data);
                    }
                  }
                  else {
                    (*(local_1e8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              lVar16 = lVar16 + 1;
              lVar15 = lVar15 + uVar2._4_4_;
              lVar17 = lVar17 + local_118;
            } while (lVar16 < *(int *)(&this->field_0xf0 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
        }
        uVar1._0_4_ = 0;
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_148._0_8_ == (Allocator *)0x0) {
        if ((void *)local_168._0_8_ != (void *)0x0) {
          free((void *)local_168._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_148._0_8_)[3])();
      }
    }
  }
LAB_0015a2f8:
  if ((int *)local_1a8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1a8._8_8_ = *(int *)local_1a8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_1a8._8_8_ == 0) {
      if (local_188 == (Allocator *)0x0) {
        if ((void *)local_1a8._0_8_ != (void *)0x0) {
          free((void *)local_1a8._0_8_);
        }
      }
      else {
        (*local_188->_vptr_Allocator[3])();
      }
    }
  }
  return (int)uVar1;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        bottom_blob_unbordered.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_unbordered.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_unbordered.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_unbordered.channel_range(channels_g * g, channels_g);

            quantize_float32_to_int8(bottom_blob_g, bottom_blob_int8_g, bottom_blob_int8_scales[g], opt_g);
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (use_int8_requantize)
        {
            std::vector<float> requantize_scales;
            for (int g=0; g<group; g++)
            {
                float scale_in;
                if (weight_data_int8_scales[g] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                float scale_out = top_blob_int8_scale;

                requantize_scales.push_back(scale_in);
                requantize_scales.push_back(scale_out);
            }

            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
        else
        {
            std::vector<float> dequantize_scales;
            for (int g=0; g<group; g++)
            {
                float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                dequantize_scales.push_back(top_rescale);
            }

            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1)
            {
                convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2 && dilation_w == 1 && dilation_h == 1)
            {
                convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}